

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O3

string * __thiscall
glcts::GeometryShaderRenderingLinesCase::getGeometryShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderRenderingLinesCase *this)

{
  int iVar1;
  TestError *pTVar2;
  string *psVar3;
  string lines_gs_code_string;
  string lines_adjacency_gs_code_string;
  stringstream lines_gs_code_stringstream;
  stringstream lines_adjacency_gs_code_stringstream;
  long *local_3a0 [2];
  long local_390 [2];
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370;
  undefined7 uStack_36f;
  undefined1 *local_360;
  undefined8 local_358;
  undefined1 local_350;
  undefined7 uStack_34f;
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304;
  if (iVar1 == 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_360 = &local_350;
    local_358 = 0;
    local_350 = 0;
    std::__cxx11::stringstream::stringstream(local_340);
    local_380 = &local_370;
    local_378 = 0;
    local_370 = 0;
    if (this->m_drawcall_mode - 1 < 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "${VERSION}\n\n${GEOMETRY_SHADER_ENABLE}\n\nlayout(lines)                   in;\nlayout(points, max_vertices=72) out;\n\n#define N_VERTEX0     (0)\n#define N_VERTEX1     (1)\n#define N_VERTICES_IN (2)\n\n"
                 ,0xc0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "\nin  vec4 vs_gs_color[N_VERTICES_IN];\nout vec4 gs_fs_color;\n\nuniform ivec2 renderingTargetSize;\n\nvoid main()\n{\n    float dx = float(2.0) / float(renderingTargetSize.x);\n    float dy = float(2.0) / float(renderingTargetSize.y);\n\n    vec4 start_pos = gl_in[N_VERTEX0].gl_Position;\n    vec4 end_pos   = gl_in[N_VERTEX1].gl_Position;\n    vec4 start_col = vs_gs_color[N_VERTEX0];\n    vec4 end_col   = vs_gs_color[N_VERTEX1];\n    vec4 delta_col = (end_col - start_col) / vec4(7.0);\n    vec4 delta_pos = (end_pos - start_pos) / vec4(7.0);\n\n    for (int n_point = 0; n_point < 8; ++n_point)\n    {\n        vec4 ref_color = start_col + vec4(float(n_point)) * delta_col;\n        vec4 ref_pos   = start_pos + vec4(float(n_point)) * delta_pos;\n\n        gl_Position  = ref_pos + vec4(-dx, -dy, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(0, -dy, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(dx, -dy, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(-dx, 0, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(0, 0, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(dx, 0, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(-dx, dy, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(0, dy, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(dx, dy, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n    }\n}\n"
                 ,0x6b9);
      std::__cxx11::stringbuf::str();
      psVar3 = (string *)&local_380;
    }
    else {
      if (1 < this->m_drawcall_mode - 10) {
        pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar2,"Unrecognized draw call mode",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xb70);
        __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "${VERSION}\n\n${GEOMETRY_SHADER_ENABLE}\n\nlayout(lines_adjacency)         in;\nlayout(points, max_vertices=72) out;\n\n#define N_VERTEX0     (1)\n#define N_VERTEX1     (2)\n#define N_VERTICES_IN (4)\n\n"
                 ,0xc0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\nin  vec4 vs_gs_color[N_VERTICES_IN];\nout vec4 gs_fs_color;\n\nuniform ivec2 renderingTargetSize;\n\nvoid main()\n{\n    float dx = float(2.0) / float(renderingTargetSize.x);\n    float dy = float(2.0) / float(renderingTargetSize.y);\n\n    vec4 start_pos = gl_in[N_VERTEX0].gl_Position;\n    vec4 end_pos   = gl_in[N_VERTEX1].gl_Position;\n    vec4 start_col = vs_gs_color[N_VERTEX0];\n    vec4 end_col   = vs_gs_color[N_VERTEX1];\n    vec4 delta_col = (end_col - start_col) / vec4(7.0);\n    vec4 delta_pos = (end_pos - start_pos) / vec4(7.0);\n\n    for (int n_point = 0; n_point < 8; ++n_point)\n    {\n        vec4 ref_color = start_col + vec4(float(n_point)) * delta_col;\n        vec4 ref_pos   = start_pos + vec4(float(n_point)) * delta_pos;\n\n        gl_Position  = ref_pos + vec4(-dx, -dy, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(0, -dy, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(dx, -dy, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(-dx, 0, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(0, 0, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(dx, 0, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(-dx, dy, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(0, dy, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n        gl_Position  = ref_pos + vec4(dx, dy, 0, 0);\n        gs_fs_color  = ref_color;\n        EmitVertex();\n    }\n}\n"
                 ,0x6b9);
      std::__cxx11::stringbuf::str();
      psVar3 = (string *)&local_360;
    }
    std::__cxx11::string::operator=(psVar3,(string *)local_3a0);
    if (local_3a0[0] != local_390) {
      operator_delete(local_3a0[0],local_390[0] + 1);
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else if (iVar1 == 2) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_360 = &local_350;
    local_358 = 0;
    local_350 = 0;
    std::__cxx11::stringstream::stringstream(local_340);
    local_380 = &local_370;
    local_378 = 0;
    local_370 = 0;
    if (this->m_drawcall_mode - 1 < 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "${VERSION}\n\n${GEOMETRY_SHADER_ENABLE}\n\nlayout(lines)                          in;\nlayout(triangle_strip, max_vertices=3) out;\n\n#define N_VERTEX0     (0)\n#define N_VERTEX1     (1)\n#define N_VERTICES_IN (2)\n"
                 ,0xcd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "flat in   int instance_id[N_VERTICES_IN];\n     in  vec4 vs_gs_color[N_VERTICES_IN];\n     out vec4 gs_fs_color;\n\nuniform ivec2 renderingTargetSize;\n\nvoid main()\n{\n    float dx = float(1.5) / float(renderingTargetSize.x);\n    float dy = float(1.5) / float(renderingTargetSize.y);\n\n    gl_Position = gl_in[N_VERTEX0].gl_Position;\n    gs_fs_color = vs_gs_color[N_VERTEX0];\n    EmitVertex();\n\n    gl_Position = gl_in[N_VERTEX1].gl_Position;\n    gs_fs_color = vs_gs_color[N_VERTEX0];\n    EmitVertex();\n\n    if (renderingTargetSize.y == 45 /* block size */)\n    {\n        gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n    }\n    else\n    {\n        float y = -1.0 + 1.0 / 4.0 + float(instance_id[0]) * 0.5;\n\n        gl_Position = vec4(0.0, y, 0.0, 1.0);\n    }\n\n    gs_fs_color = vs_gs_color[N_VERTEX0];\n    EmitVertex();\n\n    EndPrimitive();\n}\n"
                 ,0x33d);
      std::__cxx11::stringbuf::str();
      psVar3 = (string *)&local_380;
    }
    else {
      if (1 < this->m_drawcall_mode - 10) {
        pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar2,"Unrecognized draw call mode",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xb90);
        __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "${VERSION}\n\n${GEOMETRY_SHADER_ENABLE}\n\nlayout(lines_adjacency)                in;\nlayout(triangle_strip, max_vertices=3) out;\n\n#define N_VERTEX0     (1)\n#define N_VERTEX1     (2)\n#define N_VERTICES_IN (4)\n"
                 ,0xcd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "flat in   int instance_id[N_VERTICES_IN];\n     in  vec4 vs_gs_color[N_VERTICES_IN];\n     out vec4 gs_fs_color;\n\nuniform ivec2 renderingTargetSize;\n\nvoid main()\n{\n    float dx = float(1.5) / float(renderingTargetSize.x);\n    float dy = float(1.5) / float(renderingTargetSize.y);\n\n    gl_Position = gl_in[N_VERTEX0].gl_Position;\n    gs_fs_color = vs_gs_color[N_VERTEX0];\n    EmitVertex();\n\n    gl_Position = gl_in[N_VERTEX1].gl_Position;\n    gs_fs_color = vs_gs_color[N_VERTEX0];\n    EmitVertex();\n\n    if (renderingTargetSize.y == 45 /* block size */)\n    {\n        gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n    }\n    else\n    {\n        float y = -1.0 + 1.0 / 4.0 + float(instance_id[0]) * 0.5;\n\n        gl_Position = vec4(0.0, y, 0.0, 1.0);\n    }\n\n    gs_fs_color = vs_gs_color[N_VERTEX0];\n    EmitVertex();\n\n    EndPrimitive();\n}\n"
                 ,0x33d);
      std::__cxx11::stringbuf::str();
      psVar3 = (string *)&local_360;
    }
    std::__cxx11::string::operator=(psVar3,(string *)local_3a0);
    if (local_3a0[0] != local_390) {
      operator_delete(local_3a0[0],local_390[0] + 1);
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    if (iVar1 != 1) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Requested shader output layout qualifier is unsupported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xb98);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_360 = &local_350;
    local_358 = 0;
    local_350 = 0;
    std::__cxx11::stringstream::stringstream(local_340);
    local_380 = &local_370;
    local_378 = 0;
    local_370 = 0;
    if (this->m_drawcall_mode - 1 < 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "${VERSION}\n\n${GEOMETRY_SHADER_ENABLE}\n\nlayout(lines)                      in;\nlayout(line_strip, max_vertices=6) out;\n\n#define N_VERTICES_IN (2)\n#define N_VERTEX0     (0)\n#define N_VERTEX1     (1)\n\n"
                 ,0xc6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "\nin  vec4 vs_gs_color[N_VERTICES_IN];\nout vec4 gs_fs_color;\n\nuniform ivec2 renderingTargetSize;\n\nvoid main()\n{\n    float dx = float(2.0) / float(renderingTargetSize.x);\n    float dy = float(2.0) / float(renderingTargetSize.y);\n\n    vec4 start_pos = gl_in[N_VERTEX0].gl_Position;\n    vec4 end_pos   = gl_in[N_VERTEX1].gl_Position;\n    vec4 start_col = vs_gs_color[N_VERTEX0];\n    vec4 end_col   = vs_gs_color[N_VERTEX1];\n\n    if (start_pos.x != end_pos.x)\n    {\n        gl_Position = vec4(-1.0, start_pos.y + dy, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n\n        gl_Position = vec4(1.0, end_pos.y + dy, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n        EndPrimitive();\n        gl_Position = vec4(-1.0, start_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n\n        gl_Position = vec4(1.0, end_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n        EndPrimitive();\n        gl_Position = vec4(-1.0, start_pos.y - dy, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n\n        gl_Position = vec4(1.0, end_pos.y - dy, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n        EndPrimitive();\n    }\n    else\n    {\n        gl_Position = vec4(start_pos.x - dx, start_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n\n        gl_Position = vec4(end_pos.x - dx, end_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n        EndPrimitive();\n        gl_Position = vec4(start_pos.x, start_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n\n        gl_Position = vec4(end_pos.x, end_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n        EndPrimitive();\n        gl_Position = vec4(start_pos.x + dx, start_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitV..." /* TRUNCATED STRING LITERAL */
                 ,0x8b1);
      std::__cxx11::stringbuf::str();
      psVar3 = (string *)&local_380;
    }
    else {
      if (1 < this->m_drawcall_mode - 10) {
        pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar2,"Unrecognized draw call mode",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xb50);
        __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "${VERSION}\n\n${GEOMETRY_SHADER_ENABLE}\n\nlayout(lines_adjacency)            in;\nlayout(line_strip, max_vertices=6) out;\n\n#define N_VERTICES_IN (4)\n#define N_VERTEX0     (1)\n#define N_VERTEX1     (2)\n\n"
                 ,0xc6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "\nin  vec4 vs_gs_color[N_VERTICES_IN];\nout vec4 gs_fs_color;\n\nuniform ivec2 renderingTargetSize;\n\nvoid main()\n{\n    float dx = float(2.0) / float(renderingTargetSize.x);\n    float dy = float(2.0) / float(renderingTargetSize.y);\n\n    vec4 start_pos = gl_in[N_VERTEX0].gl_Position;\n    vec4 end_pos   = gl_in[N_VERTEX1].gl_Position;\n    vec4 start_col = vs_gs_color[N_VERTEX0];\n    vec4 end_col   = vs_gs_color[N_VERTEX1];\n\n    if (start_pos.x != end_pos.x)\n    {\n        gl_Position = vec4(-1.0, start_pos.y + dy, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n\n        gl_Position = vec4(1.0, end_pos.y + dy, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n        EndPrimitive();\n        gl_Position = vec4(-1.0, start_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n\n        gl_Position = vec4(1.0, end_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n        EndPrimitive();\n        gl_Position = vec4(-1.0, start_pos.y - dy, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n\n        gl_Position = vec4(1.0, end_pos.y - dy, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n        EndPrimitive();\n    }\n    else\n    {\n        gl_Position = vec4(start_pos.x - dx, start_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n\n        gl_Position = vec4(end_pos.x - dx, end_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n        EndPrimitive();\n        gl_Position = vec4(start_pos.x, start_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n\n        gl_Position = vec4(end_pos.x, end_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitVertex();\n        EndPrimitive();\n        gl_Position = vec4(start_pos.x + dx, start_pos.y, 0, 1);\n        gs_fs_color = mix(start_col, end_col, 0.5);\n        EmitV..." /* TRUNCATED STRING LITERAL */
                 ,0x8b1);
      std::__cxx11::stringbuf::str();
      psVar3 = (string *)&local_360;
    }
    std::__cxx11::string::operator=(psVar3,(string *)local_3a0);
    if (local_3a0[0] != local_390) {
      operator_delete(local_3a0[0],local_390[0] + 1);
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,CONCAT71(uStack_36f,local_370) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  if (local_360 != &local_350) {
    operator_delete(local_360,CONCAT71(uStack_34f,local_350) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderRenderingLinesCase::getGeometryShaderCode()
{
	static const char* lines_in_line_strip_out_gs_code_preamble = "${VERSION}\n"
																  "\n"
																  "${GEOMETRY_SHADER_ENABLE}\n"
																  "\n"
																  "layout(lines)                      in;\n"
																  "layout(line_strip, max_vertices=6) out;\n"
																  "\n"
																  "#define N_VERTICES_IN (2)\n"
																  "#define N_VERTEX0     (0)\n"
																  "#define N_VERTEX1     (1)\n"
																  "\n";

	static const char* lines_adjacency_in_line_strip_out_gs_code_preamble = "${VERSION}\n"
																			"\n"
																			"${GEOMETRY_SHADER_ENABLE}\n"
																			"\n"
																			"layout(lines_adjacency)            in;\n"
																			"layout(line_strip, max_vertices=6) out;\n"
																			"\n"
																			"#define N_VERTICES_IN (4)\n"
																			"#define N_VERTEX0     (1)\n"
																			"#define N_VERTEX1     (2)\n"
																			"\n";

	static const char* lines_gs_code_main = "\n"
											"in  vec4 vs_gs_color[N_VERTICES_IN];\n"
											"out vec4 gs_fs_color;\n"
											"\n"
											"uniform ivec2 renderingTargetSize;\n"
											"\n"
											"void main()\n"
											"{\n"
											"    float dx = float(2.0) / float(renderingTargetSize.x);\n"
											"    float dy = float(2.0) / float(renderingTargetSize.y);\n"
											"\n"
											"    vec4 start_pos = gl_in[N_VERTEX0].gl_Position;\n"
											"    vec4 end_pos   = gl_in[N_VERTEX1].gl_Position;\n"
											"    vec4 start_col = vs_gs_color[N_VERTEX0];\n"
											"    vec4 end_col   = vs_gs_color[N_VERTEX1];\n"
											"\n"
											/* Determine if this is a horizontal or vertical edge */
											"    if (start_pos.x != end_pos.x)\n"
											"    {\n"
											/* Bottom line segment */
											"        gl_Position = vec4(-1.0, start_pos.y + dy, 0, 1);\n"
											"        gs_fs_color = mix(start_col, end_col, 0.5);\n"
											"        EmitVertex();\n"
											"\n"
											"        gl_Position = vec4(1.0, end_pos.y + dy, 0, 1);\n"
											"        gs_fs_color = mix(start_col, end_col, 0.5);\n"
											"        EmitVertex();\n"
											"        EndPrimitive();\n"
											/* Middle line segment */
											"        gl_Position = vec4(-1.0, start_pos.y, 0, 1);\n"
											"        gs_fs_color = mix(start_col, end_col, 0.5);\n"
											"        EmitVertex();\n"
											"\n"
											"        gl_Position = vec4(1.0, end_pos.y, 0, 1);\n"
											"        gs_fs_color = mix(start_col, end_col, 0.5);\n"
											"        EmitVertex();\n"
											"        EndPrimitive();\n"
											/* Top line segment */
											"        gl_Position = vec4(-1.0, start_pos.y - dy, 0, 1);\n"
											"        gs_fs_color = mix(start_col, end_col, 0.5);\n"
											"        EmitVertex();\n"
											"\n"
											"        gl_Position = vec4(1.0, end_pos.y - dy, 0, 1);\n"
											"        gs_fs_color = mix(start_col, end_col, 0.5);\n"
											"        EmitVertex();\n"
											"        EndPrimitive();\n"
											"    }\n"
											"    else\n"
											"    {\n"
											/* Left line segment */
											"        gl_Position = vec4(start_pos.x - dx, start_pos.y, 0, 1);\n"
											"        gs_fs_color = mix(start_col, end_col, 0.5);\n"
											"        EmitVertex();\n"
											"\n"
											"        gl_Position = vec4(end_pos.x - dx, end_pos.y, 0, 1);\n"
											"        gs_fs_color = mix(start_col, end_col, 0.5);\n"
											"        EmitVertex();\n"
											"        EndPrimitive();\n"
											/* Middle line segment */
											"        gl_Position = vec4(start_pos.x, start_pos.y, 0, 1);\n"
											"        gs_fs_color = mix(start_col, end_col, 0.5);\n"
											"        EmitVertex();\n"
											"\n"
											"        gl_Position = vec4(end_pos.x, end_pos.y, 0, 1);\n"
											"        gs_fs_color = mix(start_col, end_col, 0.5);\n"
											"        EmitVertex();\n"
											"        EndPrimitive();\n"
											/* Right line segment */
											"        gl_Position = vec4(start_pos.x + dx, start_pos.y, 0, 1);\n"
											"        gs_fs_color = mix(start_col, end_col, 0.5);\n"
											"        EmitVertex();\n"
											"\n"
											"        gl_Position = vec4(end_pos.x + dx, end_pos.y, 0, 1);\n"
											"        gs_fs_color = mix(start_col, end_col, 0.5);\n"
											"        EmitVertex();\n"
											"        EndPrimitive();\n"
											"    }\n"
											"}\n";

	static const char* lines_in_points_out_gs_code_preamble = "${VERSION}\n"
															  "\n"
															  "${GEOMETRY_SHADER_ENABLE}\n"
															  "\n"
															  "layout(lines)                   in;\n"
															  "layout(points, max_vertices=72) out;\n"
															  "\n"
															  "#define N_VERTEX0     (0)\n"
															  "#define N_VERTEX1     (1)\n"
															  "#define N_VERTICES_IN (2)\n"
															  "\n";

	static const char* lines_adjacency_in_points_out_gs_code_preamble = "${VERSION}\n"
																		"\n"
																		"${GEOMETRY_SHADER_ENABLE}\n"
																		"\n"
																		"layout(lines_adjacency)         in;\n"
																		"layout(points, max_vertices=72) out;\n"
																		"\n"
																		"#define N_VERTEX0     (1)\n"
																		"#define N_VERTEX1     (2)\n"
																		"#define N_VERTICES_IN (4)\n"
																		"\n";

	static const char* points_gs_code_main = "\n"
											 "in  vec4 vs_gs_color[N_VERTICES_IN];\n"
											 "out vec4 gs_fs_color;\n"
											 "\n"
											 "uniform ivec2 renderingTargetSize;\n"
											 "\n"
											 "void main()\n"
											 "{\n"
											 "    float dx = float(2.0) / float(renderingTargetSize.x);\n"
											 "    float dy = float(2.0) / float(renderingTargetSize.y);\n"
											 "\n"
											 "    vec4 start_pos = gl_in[N_VERTEX0].gl_Position;\n"
											 "    vec4 end_pos   = gl_in[N_VERTEX1].gl_Position;\n"
											 "    vec4 start_col = vs_gs_color[N_VERTEX0];\n"
											 "    vec4 end_col   = vs_gs_color[N_VERTEX1];\n"
											 "    vec4 delta_col = (end_col - start_col) / vec4(7.0);\n"
											 "    vec4 delta_pos = (end_pos - start_pos) / vec4(7.0);\n"
											 "\n"
											 "    for (int n_point = 0; n_point < 8; ++n_point)\n"
											 "    {\n"
											 "        vec4 ref_color = start_col + vec4(float(n_point)) * delta_col;\n"
											 "        vec4 ref_pos   = start_pos + vec4(float(n_point)) * delta_pos;\n"
											 "\n"
											 /* TL */
											 "        gl_Position  = ref_pos + vec4(-dx, -dy, 0, 0);\n"
											 "        gs_fs_color  = ref_color;\n"
											 "        EmitVertex();\n"
											 /* TM */
											 "        gl_Position  = ref_pos + vec4(0, -dy, 0, 0);\n"
											 "        gs_fs_color  = ref_color;\n"
											 "        EmitVertex();\n"
											 /* TR */
											 "        gl_Position  = ref_pos + vec4(dx, -dy, 0, 0);\n"
											 "        gs_fs_color  = ref_color;\n"
											 "        EmitVertex();\n"
											 /* ML */
											 "        gl_Position  = ref_pos + vec4(-dx, 0, 0, 0);\n"
											 "        gs_fs_color  = ref_color;\n"
											 "        EmitVertex();\n"
											 /* MM */
											 "        gl_Position  = ref_pos + vec4(0, 0, 0, 0);\n"
											 "        gs_fs_color  = ref_color;\n"
											 "        EmitVertex();\n"
											 /* MR */
											 "        gl_Position  = ref_pos + vec4(dx, 0, 0, 0);\n"
											 "        gs_fs_color  = ref_color;\n"
											 "        EmitVertex();\n"
											 /* BL */
											 "        gl_Position  = ref_pos + vec4(-dx, dy, 0, 0);\n"
											 "        gs_fs_color  = ref_color;\n"
											 "        EmitVertex();\n"
											 /* BM */
											 "        gl_Position  = ref_pos + vec4(0, dy, 0, 0);\n"
											 "        gs_fs_color  = ref_color;\n"
											 "        EmitVertex();\n"
											 /* BR */
											 "        gl_Position  = ref_pos + vec4(dx, dy, 0, 0);\n"
											 "        gs_fs_color  = ref_color;\n"
											 "        EmitVertex();\n"
											 "    }\n"
											 "}\n";

	static const char* lines_adjacency_in_triangle_strip_out_gs_code_preamble =
		"${VERSION}\n"
		"\n"
		"${GEOMETRY_SHADER_ENABLE}\n"
		"\n"
		"layout(lines_adjacency)                in;\n"
		"layout(triangle_strip, max_vertices=3) out;\n"
		"\n"
		"#define N_VERTEX0     (1)\n"
		"#define N_VERTEX1     (2)\n"
		"#define N_VERTICES_IN (4)\n";

	static const char* lines_in_triangle_strip_out_gs_code_preamble = "${VERSION}\n"
																	  "\n"
																	  "${GEOMETRY_SHADER_ENABLE}\n"
																	  "\n"
																	  "layout(lines)                          in;\n"
																	  "layout(triangle_strip, max_vertices=3) out;\n"
																	  "\n"
																	  "#define N_VERTEX0     (0)\n"
																	  "#define N_VERTEX1     (1)\n"
																	  "#define N_VERTICES_IN (2)\n";

	static const char* triangles_gs_code_main = "flat in   int instance_id[N_VERTICES_IN];\n"
												"     in  vec4 vs_gs_color[N_VERTICES_IN];\n"
												"     out vec4 gs_fs_color;\n"
												"\n"
												"uniform ivec2 renderingTargetSize;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    float dx = float(1.5) / float(renderingTargetSize.x);\n"
												"    float dy = float(1.5) / float(renderingTargetSize.y);\n"
												"\n"
												"    gl_Position = gl_in[N_VERTEX0].gl_Position;\n"
												"    gs_fs_color = vs_gs_color[N_VERTEX0];\n"
												"    EmitVertex();\n"
												"\n"
												"    gl_Position = gl_in[N_VERTEX1].gl_Position;\n"
												"    gs_fs_color = vs_gs_color[N_VERTEX0];\n"
												"    EmitVertex();\n"
												"\n"
												"    if (renderingTargetSize.y == 45 /* block size */)\n"
												"    {\n"
												"        gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
												"    }\n"
												"    else\n"
												"    {\n"
												/* Each block takes 1/4th of the total render target.
		 * Third vertex should be placed in the middle of the block.
		 */
												"        float y = -1.0 + 1.0 / 4.0 + float(instance_id[0]) * 0.5;\n"
												"\n"
												"        gl_Position = vec4(0.0, y, 0.0, 1.0);\n"
												"    }\n"
												"\n"
												"    gs_fs_color = vs_gs_color[N_VERTEX0];\n"
												"    EmitVertex();\n"
												"\n"
												"    EndPrimitive();\n"
												"}\n";
	std::string result;

	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	{
		std::stringstream lines_adjacency_gs_code_stringstream;
		std::string		  lines_adjacency_gs_code_string;
		std::stringstream lines_gs_code_stringstream;
		std::string		  lines_gs_code_string;

		if (m_drawcall_mode == GL_LINES_ADJACENCY_EXT || m_drawcall_mode == GL_LINE_STRIP_ADJACENCY_EXT)
		{
			/* First request for lines_adjacency GS, form the string */
			lines_adjacency_gs_code_stringstream << lines_adjacency_in_line_strip_out_gs_code_preamble
												 << lines_gs_code_main;

			lines_adjacency_gs_code_string = lines_adjacency_gs_code_stringstream.str();
			result						   = lines_adjacency_gs_code_string;
		}
		else if (m_drawcall_mode == GL_LINES || m_drawcall_mode == GL_LINE_LOOP || m_drawcall_mode == GL_LINE_STRIP)
		{
			/* First request for lines GS, form the string */
			lines_gs_code_stringstream << lines_in_line_strip_out_gs_code_preamble << lines_gs_code_main;

			lines_gs_code_string = lines_gs_code_stringstream.str();
			result				 = lines_gs_code_string;
		}
		else
		{
			TCU_FAIL("Unrecognized draw call mode");
		}

		break;
	}

	case SHADER_OUTPUT_TYPE_POINTS:
	{
		std::stringstream lines_adjacency_gs_code_stringstream;
		std::string		  lines_adjacency_gs_code_string;
		std::stringstream lines_gs_code_stringstream;
		std::string		  lines_gs_code_string;

		if (m_drawcall_mode == GL_LINES_ADJACENCY_EXT || m_drawcall_mode == GL_LINE_STRIP_ADJACENCY_EXT)
		{
			/* First request for lines_adjacency GS, form the string */
			lines_adjacency_gs_code_stringstream << lines_adjacency_in_points_out_gs_code_preamble
												 << points_gs_code_main;

			lines_adjacency_gs_code_string = lines_adjacency_gs_code_stringstream.str();
			result						   = lines_adjacency_gs_code_string;
		}
		else if (m_drawcall_mode == GL_LINES || m_drawcall_mode == GL_LINE_LOOP || m_drawcall_mode == GL_LINE_STRIP)
		{
			/* First request for lines GS, form the string */
			lines_gs_code_stringstream << lines_in_points_out_gs_code_preamble << points_gs_code_main;

			lines_gs_code_string = lines_gs_code_stringstream.str();
			result				 = lines_gs_code_string;
		}
		else
		{
			TCU_FAIL("Unrecognized draw call mode");
		}

		break;
	}

	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		std::stringstream lines_adjacency_gs_code_stringstream;
		std::string		  lines_adjacency_gs_code_string;
		std::stringstream lines_gs_code_stringstream;
		std::string		  lines_gs_code_string;

		if (m_drawcall_mode == GL_LINES_ADJACENCY_EXT || m_drawcall_mode == GL_LINE_STRIP_ADJACENCY_EXT)
		{
			/* First request for lines_adjacency GS, form the string */
			lines_adjacency_gs_code_stringstream << lines_adjacency_in_triangle_strip_out_gs_code_preamble
												 << triangles_gs_code_main;

			lines_adjacency_gs_code_string = lines_adjacency_gs_code_stringstream.str();
			result						   = lines_adjacency_gs_code_string;
		}
		else if (m_drawcall_mode == GL_LINES || m_drawcall_mode == GL_LINE_LOOP || m_drawcall_mode == GL_LINE_STRIP)
		{
			/* First request for lines GS, form the string */
			lines_gs_code_stringstream << lines_in_triangle_strip_out_gs_code_preamble << triangles_gs_code_main;

			lines_gs_code_string = lines_gs_code_stringstream.str();
			result				 = lines_gs_code_string;
		}
		else
		{
			TCU_FAIL("Unrecognized draw call mode");
		}

		break;
	}

	default:
	{
		TCU_FAIL("Requested shader output layout qualifier is unsupported");
	}
	} /* switch (m_output_type) */

	return result;
}